

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder
          (SimpleFilteredBreakIteratorBuilder *this,Locale *fromLocale,UErrorCode *status)

{
  UBool UVar1;
  char *localeID;
  UResourceBundle *pUVar2;
  UResourceBundle *fillIn;
  bool bVar3;
  undefined1 local_98 [8];
  UnicodeString str;
  LocalUResourceBundlePointer strs;
  LocalUResourceBundlePointer breaks;
  LocalUResourceBundlePointer exceptions;
  LocalPointerBase<UResourceBundle> local_38;
  LocalUResourceBundlePointer b;
  UErrorCode subStatus;
  UErrorCode *status_local;
  Locale *fromLocale_local;
  SimpleFilteredBreakIteratorBuilder *this_local;
  
  FilteredBreakIteratorBuilder::FilteredBreakIteratorBuilder
            (&this->super_FilteredBreakIteratorBuilder);
  (this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredBreakIteratorBuilder_005c0658;
  UStringSet::UStringSet(&this->fSet,status);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    b.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = U_ZERO_ERROR;
    localeID = Locale::getBaseName(fromLocale);
    pUVar2 = ures_open_63("icudt63l-brkitr",localeID,(UErrorCode *)&b);
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_38,pUVar2);
    UVar1 = ::U_FAILURE((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr);
    if ((UVar1 == '\0') &&
       ((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr != U_USING_DEFAULT_WARNING)) {
      pUVar2 = LocalPointerBase<UResourceBundle>::getAlias(&local_38);
      pUVar2 = ures_getByKeyWithFallback_63
                         (pUVar2,"exceptions",(UResourceBundle *)0x0,(UErrorCode *)&b);
      LocalUResourceBundlePointer::LocalUResourceBundlePointer(&breaks,pUVar2);
      UVar1 = ::U_FAILURE((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr);
      if ((UVar1 == '\0') &&
         ((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr != U_USING_DEFAULT_WARNING)) {
        pUVar2 = LocalPointerBase<UResourceBundle>::getAlias
                           (&breaks.super_LocalPointerBase<UResourceBundle>);
        pUVar2 = ures_getByKeyWithFallback_63
                           (pUVar2,"SentenceBreak",(UResourceBundle *)0x0,(UErrorCode *)&b);
        LocalUResourceBundlePointer::LocalUResourceBundlePointer(&strs,pUVar2);
        UVar1 = ::U_FAILURE((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr);
        if ((UVar1 == '\0') &&
           ((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr != U_USING_DEFAULT_WARNING)) {
          LocalUResourceBundlePointer::LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)((long)&str.fUnion + 0x30),
                     (UResourceBundle *)0x0);
          b.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = *status;
          do {
            pUVar2 = LocalPointerBase<UResourceBundle>::getAlias
                               (&strs.super_LocalPointerBase<UResourceBundle>);
            fillIn = LocalPointerBase<UResourceBundle>::orphan
                               ((LocalPointerBase<UResourceBundle> *)((long)&str.fUnion + 0x30));
            pUVar2 = ures_getNextResource_63(pUVar2,fillIn,(UErrorCode *)&b);
            LocalUResourceBundlePointer::adoptInstead
                      ((LocalUResourceBundlePointer *)((long)&str.fUnion + 0x30),pUVar2);
            UVar1 = LocalPointerBase<UResourceBundle>::isValid
                              ((LocalPointerBase<UResourceBundle> *)((long)&str.fUnion + 0x30));
            if ((UVar1 != '\0') &&
               (UVar1 = ::U_SUCCESS((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr),
               UVar1 != '\0')) {
              pUVar2 = LocalPointerBase<UResourceBundle>::getAlias
                                 ((LocalPointerBase<UResourceBundle> *)((long)&str.fUnion + 0x30));
              ures_getUnicodeString((UnicodeString *)local_98,pUVar2,status);
              (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[3])
                        (this,local_98,status);
              icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_98);
            }
            UVar1 = LocalPointerBase<UResourceBundle>::isValid
                              ((LocalPointerBase<UResourceBundle> *)((long)&str.fUnion + 0x30));
            bVar3 = false;
            if (UVar1 != '\0') {
              UVar1 = ::U_SUCCESS((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr);
              bVar3 = UVar1 != '\0';
            }
          } while (bVar3);
          UVar1 = ::U_FAILURE((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr);
          if (((UVar1 != '\0') &&
              ((UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr !=
               U_INDEX_OUTOFBOUNDS_ERROR)) && (UVar1 = ::U_SUCCESS(*status), UVar1 != '\0')) {
            *status = (UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr;
          }
          LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)((long)&str.fUnion + 0x30));
        }
        else {
          *status = (UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr;
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&strs);
      }
      else {
        *status = (UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr;
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&breaks);
    }
    else {
      *status = (UErrorCode)b.super_LocalPointerBase<UResourceBundle>.ptr;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_38);
  }
  return;
}

Assistant:

SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(const Locale &fromLocale, UErrorCode &status)
  : fSet(status)
{
  if(U_SUCCESS(status)) {
    UErrorCode subStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer b(ures_open(U_ICUDATA_BRKITR, fromLocale.getBaseName(), &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open BUNDLE %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer exceptions(ures_getByKeyWithFallback(b.getAlias(), "exceptions", NULL, &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open EXCEPTIONS %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer breaks(ures_getByKeyWithFallback(exceptions.getAlias(), "SentenceBreak", NULL, &subStatus));

#if FB_DEBUG
    {
      UErrorCode subsub = subStatus;
      fprintf(stderr, "open SentenceBreak %s => %s, %s\n", fromLocale.getBaseName(), ures_getLocale(breaks.getAlias(), &subsub), u_errorName(subStatus));
    }
#endif
    
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }

    LocalUResourceBundlePointer strs;
    subStatus = status; // Pick up inherited warning status now 
    do {
      strs.adoptInstead(ures_getNextResource(breaks.getAlias(), strs.orphan(), &subStatus));
      if(strs.isValid() && U_SUCCESS(subStatus)) {
        UnicodeString str(ures_getUnicodeString(strs.getAlias(), &status));
        suppressBreakAfter(str, status); // load the string
      }
    } while (strs.isValid() && U_SUCCESS(subStatus));
    if(U_FAILURE(subStatus)&&subStatus!=U_INDEX_OUTOFBOUNDS_ERROR&&U_SUCCESS(status)) {
      status = subStatus;
    }
  }
}